

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapi_curl.c
# Opt level: O0

size_t HeadersWriteFunction(void *ptr,size_t size,size_t nmemb,void *userdata)

{
  char *pcVar1;
  bool bVar2;
  char *whereIsColon;
  char *token;
  char *headerLine;
  HTTP_HEADERS_HANDLE responseHeadersHandle;
  void *userdata_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  if (ptr != (void *)0x0) {
    whereIsColon = strtok((char *)ptr,"\r\n");
    while( true ) {
      bVar2 = false;
      if (whereIsColon != (char *)0x0) {
        bVar2 = *whereIsColon != '\0';
      }
      if (!bVar2) break;
      pcVar1 = strchr(whereIsColon,0x3a);
      if (pcVar1 != (char *)0x0) {
        *pcVar1 = '\0';
        HTTPHeaders_AddHeaderNameValuePair((HTTP_HEADERS_HANDLE)userdata,whereIsColon,pcVar1 + 1);
        *pcVar1 = ':';
      }
      whereIsColon = strtok((char *)0x0,"\r\n");
    }
  }
  return size * nmemb;
}

Assistant:

static size_t HeadersWriteFunction(void *ptr, size_t size, size_t nmemb, void *userdata)
{
    HTTP_HEADERS_HANDLE responseHeadersHandle = (HTTP_HEADERS_HANDLE)userdata;
    char* headerLine = (char*)ptr;

    if (headerLine != NULL)
    {
        char* token = strtok(headerLine, "\r\n");
        while ((token != NULL) &&
               (token[0] != '\0'))
        {
            char* whereIsColon = strchr(token, ':');
            if(whereIsColon!=NULL)
            {
                *whereIsColon='\0';
                HTTPHeaders_AddHeaderNameValuePair(responseHeadersHandle, token, whereIsColon+1);
                *whereIsColon=':';
            }
            else
            {
                /*not a header, maybe a status-line*/
            }
            token = strtok(NULL, "\r\n");
        }
    }

    return size * nmemb;
}